

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_util.c
# Opt level: O3

lzma_vli lzma_block_unpadded_size(lzma_block *block)

{
  uint uVar1;
  lzma_check type;
  lzma_vli lVar2;
  uint32_t uVar3;
  lzma_vli lVar4;
  ulong uVar5;
  
  if ((block != (lzma_block *)0x0) && (block->version < 2)) {
    uVar1 = block->header_size;
    if ((uVar1 & 3) == 0 && uVar1 - 8 < 0x3f9) {
      lVar2 = block->compressed_size;
      if (lVar2 == 0 || (long)lVar2 < -1) {
        lVar4 = 0;
      }
      else {
        type = block->check;
        lVar4 = -(ulong)(type < 0x10);
        if (type < 0x10 && lVar2 != 0xffffffffffffffff) {
          uVar3 = lzma_check_size(type);
          uVar5 = (ulong)uVar3 + lVar2 + uVar1;
          lVar4 = 0;
          if (uVar5 < 0x7ffffffffffffffd) {
            lVar4 = uVar5;
          }
        }
      }
      return lVar4;
    }
  }
  return 0;
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_block_unpadded_size(const lzma_block *block)
{
	// Validate the values that we are interested in i.e. all but
	// Uncompressed Size and the filters.
	//
	// NOTE: This function is used for validation too, so it is
	// essential that these checks are always done even if
	// Compressed Size is unknown.
	if (block == NULL || block->version > 1
			|| block->header_size < LZMA_BLOCK_HEADER_SIZE_MIN
			|| block->header_size > LZMA_BLOCK_HEADER_SIZE_MAX
			|| (block->header_size & 3)
			|| !lzma_vli_is_valid(block->compressed_size)
			|| block->compressed_size == 0
			|| (unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return 0;

	// If Compressed Size is unknown, return that we cannot know
	// size of the Block either.
	if (block->compressed_size == LZMA_VLI_UNKNOWN)
		return LZMA_VLI_UNKNOWN;

	// Calculate Unpadded Size and validate it.
	const lzma_vli unpadded_size = block->compressed_size
				+ block->header_size
				+ lzma_check_size(block->check);

	assert(unpadded_size >= UNPADDED_SIZE_MIN);
	if (unpadded_size > UNPADDED_SIZE_MAX)
		return 0;

	return unpadded_size;
}